

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

bool __thiscall duckdb::Hugeint::TryCast<int>(Hugeint *this,hugeint_t input,int32_t *result)

{
  if (input.lower == 0xffffffffffffffff) {
    if ((Hugeint *)0xffffffff7fffffff < this) goto LAB_013171f8;
  }
  else if ((input.lower == 0) && (this < (Hugeint *)0x80000000)) {
LAB_013171f8:
    *(int *)input.upper = (int)this;
    return true;
  }
  return false;
}

Assistant:

bool HugeintTryCastInteger(hugeint_t input, DST &result) {
	switch (input.upper) {
	case 0:
		// positive number: check if the positive number is in range
		if (input.lower <= uint64_t(NumericLimits<DST>::Maximum())) {
			result = DST(input.lower);
			return true;
		}
		break;
	case -1:
		if (!SIGNED) {
			return false;
		}
		// negative number: check if the negative number is in range
		if (input.lower >= NumericLimits<uint64_t>::Maximum() - uint64_t(NumericLimits<DST>::Maximum())) {
			result = -DST(NumericLimits<uint64_t>::Maximum() - input.lower) - 1;
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}